

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdial.cpp
# Opt level: O2

void __thiscall QDial::mousePressEvent(QDial *this,QMouseEvent *e)

{
  QDialPrivate *this_00;
  int position;
  long in_FS_OFFSET;
  QPointF local_30;
  QPoint local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QDialPrivate **)&(this->super_QAbstractSlider).super_QWidget.field_0x8;
  if ((((this_00->super_QAbstractSliderPrivate).maximum ==
        *(int *)&(this_00->super_QAbstractSliderPrivate).super_QWidgetPrivate.field_0x254) ||
      (*(int *)(e + 0x40) != 1)) || (*(int *)(e + 0x44) != 1)) {
    e[0xc] = (QMouseEvent)0x0;
  }
  else {
    e[0xc] = (QMouseEvent)0x1;
    local_30 = QSinglePointEvent::position((QSinglePointEvent *)e);
    local_20 = QPointF::toPoint(&local_30);
    position = QDialPrivate::valueFromPoint(this_00,&local_20);
    QAbstractSlider::setSliderPosition(&this->super_QAbstractSlider,position);
    QAbstractSlider::setSliderDown(&this->super_QAbstractSlider,true);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDial::mousePressEvent(QMouseEvent *e)
{
    Q_D(QDial);
    if (d->maximum == d->minimum ||
        (e->button() != Qt::LeftButton)  ||
        (e->buttons() ^ e->button())) {
        e->ignore();
        return;
    }
    e->accept();
    setSliderPosition(d->valueFromPoint(e->position().toPoint()));
    // ### This isn't quite right,
    // we should be doing a hit test and only setting this if it's
    // the actual dial thingie (similar to what QSlider does), but we have no
    // subControls for QDial.
    setSliderDown(true);
}